

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::CaptureVertexInterleaved
          (CaptureVertexInterleaved *this,Context *context,char *test_name,char *test_description)

{
  char *test_description_local;
  char *test_name_local;
  Context *context_local;
  CaptureVertexInterleaved *this_local;
  
  deqp::TestCase::TestCase(&this->super_TestCase,context,test_name,test_description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CaptureVertexInterleaved_0322bb30;
  this->m_context = context;
  this->m_program = 0;
  this->m_framebuffer = 0;
  this->m_renderbuffer = 0;
  this->m_buffer = 0;
  this->m_buffer_size = 0;
  this->m_vertex_array_object = 0;
  this->m_max_transform_feedback_components = 0;
  this->m_attrib_type = 0x8c8c;
  this->m_max_vertices_drawn = 8;
  this->m_glBindBufferOffsetEXT = (BindBufferOffsetEXT_ProcAddress)0x0;
  return;
}

Assistant:

gl3cts::TransformFeedback::CaptureVertexInterleaved::CaptureVertexInterleaved(deqp::Context& context,
																			  const char*	test_name,
																			  const char*	test_description)
	: deqp::TestCase(context, test_name, test_description)
	, m_context(context)
	, m_program(0)
	, m_framebuffer(0)
	, m_renderbuffer(0)
	, m_buffer(0)
	, m_buffer_size(0)
	, m_vertex_array_object(0)
	, m_max_transform_feedback_components(0)
	, m_attrib_type(GL_INTERLEAVED_ATTRIBS)
	, m_max_vertices_drawn(8)
	, m_glBindBufferOffsetEXT(DE_NULL)
{
}